

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::ScissorZeroDimension::setupViewports
          (ScissorZeroDimension *this,TEST_TYPE param_1,GLuint iteration_index)

{
  TestError *this_00;
  SCISSOR_METHOD method;
  GLuint iteration_index_local;
  TEST_TYPE param_1_local;
  ScissorZeroDimension *this_local;
  
  if (iteration_index < 3) {
    DrawTestBase::setup4x4Scissor((DrawTestBase *)this,iteration_index,true);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid value",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x100b);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ScissorZeroDimension::setupViewports(TEST_TYPE /* type */, GLuint iteration_index)
{
	SCISSOR_METHOD method;
	switch (iteration_index)
	{
	case 0:
	case 1:
	case 2:
		method = (SCISSOR_METHOD)iteration_index;
		break;
	default:
		TCU_FAIL("Invalid value");
	}

	setup4x4Scissor(method, true /* set_zeros */);
}